

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * atomimm_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *peVar1;
  match *res;
  int iVar2;
  matches *__ptr;
  
  if ((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_EXPR)) {
    __ptr = alwaysmatches(spos + 1);
    peVar1 = ctx->atoms[spos]->expr;
    res = __ptr->m;
    if ((peVar1->type == EASM_EXPR_NUM) &&
       (iVar2 = setbf(res,(bitfield *)v,peVar1->num), iVar2 != 0)) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomimm_a APROTO {
	const struct bitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	struct easm_expr *expr = ctx->atoms[spos]->expr;
	if (expr->type == EASM_EXPR_NUM && setbf(res->m, bf, expr->num))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}